

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection1.c
# Opt level: O0

void ssh1_throttle_all_channels(ConnectionLayer *cl,_Bool throttled)

{
  void *pvVar1;
  int local_2c;
  int i;
  ssh1_channel *c;
  ssh1_connection_state *s;
  _Bool throttled_local;
  ConnectionLayer *cl_local;
  
  local_2c = 0;
  while( true ) {
    pvVar1 = index234((tree234 *)cl[-0xd].vt,local_2c);
    if (pvVar1 == (void *)0x0) break;
    chan_set_input_wanted(*(Channel **)((long)pvVar1 + 0x20),(_Bool)((throttled ^ 0xffU) & 1));
    local_2c = local_2c + 1;
  }
  return;
}

Assistant:

static void ssh1_throttle_all_channels(ConnectionLayer *cl, bool throttled)
{
    struct ssh1_connection_state *s =
        container_of(cl, struct ssh1_connection_state, cl);
    struct ssh1_channel *c;
    int i;

    for (i = 0; NULL != (c = index234(s->channels, i)); i++)
        chan_set_input_wanted(c->chan, !throttled);
}